

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O0

uint64_t stm_round_to_common_refresh_rate(uint64_t ticks)

{
  uint64_t uVar1;
  uint64_t tol;
  wchar_t i;
  uint64_t ns;
  uint64_t ticks_local;
  
  tol._4_4_ = 0;
  while ((uVar1 = _stm_refresh_rates[tol._4_4_][0], ticks_local = ticks, uVar1 != 0 &&
         ((ticks <= uVar1 - _stm_refresh_rates[tol._4_4_][1] ||
          (ticks_local = uVar1, uVar1 + _stm_refresh_rates[tol._4_4_][1] <= ticks))))) {
    tol._4_4_ = tol._4_4_ + 1;
  }
  return ticks_local;
}

Assistant:

SOKOL_API_IMPL uint64_t stm_round_to_common_refresh_rate(uint64_t ticks) {
    uint64_t ns;
    int i = 0;
    while (0 != (ns = _stm_refresh_rates[i][0])) {
        uint64_t tol = _stm_refresh_rates[i][1];
        if ((ticks > (ns - tol)) && (ticks < (ns + tol))) {
            return ns;
        }
        i++;
    }
    // fallthough: didn't fit into any buckets
    return ticks;
}